

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool flatbuffers::anon_unknown_0::CompareSerializedScalars(uint8_t *a,uint8_t *b,FieldDef *key)

{
  char *pcVar1;
  byte bVar2;
  uint8_t uVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  char *s;
  byte **ppbVar7;
  byte *pbVar8;
  char *pcVar9;
  longlong lVar10;
  longlong lVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  uint8_t uVar15;
  short sVar16;
  ushort uVar17;
  char *pcVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  byte *pbVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  double dVar26;
  float fVar27;
  double dVar28;
  char *endptr;
  byte *local_30;
  
  switch((key->value).type.base_type) {
  case BASE_TYPE_NONE:
    if (a != (uint8_t *)0x0 && b != (uint8_t *)0x0) goto LAB_00126ad1;
    pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
    pbVar8 = pbVar22;
    if (pbVar22 == (byte *)0x0) {
LAB_00126f2e:
      pcVar18 = "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned char]";
LAB_00126f43:
      __assert_fail("s && val",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x14b,pcVar18);
    }
    do {
      bVar2 = *pbVar8;
      pbVar8 = pbVar8 + 1;
      if (bVar2 == 0) break;
    } while (9 < (int)(char)bVar2 - 0x30U);
LAB_00126a55:
    if ((bVar2 == 0x30) && ((*pbVar8 & 0xdf) == 0x58)) {
      iVar20 = 0x10;
    }
    else {
      iVar20 = 10;
    }
    local_30 = pbVar22;
    uVar12 = strtoll_l((char *)pbVar22,(char **)&local_30,iVar20,ClassicLocale::instance_);
    if (local_30 == pbVar22 || *local_30 != 0) goto LAB_00126ad1;
    uVar13 = 0xff;
    if (uVar12 < 0xff) {
      uVar13 = uVar12;
    }
    bVar2 = (byte)uVar13;
    goto LAB_00126ad3;
  case BASE_TYPE_UTYPE:
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) goto LAB_00126f2e;
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      goto LAB_00126a55;
    }
    goto LAB_00126ad1;
  case BASE_TYPE_BOOL:
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) goto LAB_00126f2e;
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      goto LAB_00126a55;
    }
    goto LAB_00126ad1;
  case BASE_TYPE_CHAR:
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToNumber(const char *, T *) [T = signed char]";
        goto LAB_00126f43;
      }
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      if ((bVar2 == 0x30) && ((*pbVar8 & 0xdf) == 0x58)) {
        iVar20 = 0x10;
      }
      else {
        iVar20 = 10;
      }
      local_30 = pbVar22;
      lVar10 = strtoll_l((char *)pbVar22,(char **)&local_30,iVar20,ClassicLocale::instance_);
      if (local_30 == pbVar22 || *local_30 != 0) goto LAB_00126d3a;
      uVar3 = '\x7f';
      if (lVar10 < 0x80) {
        lVar11 = -0x80;
        if (-0x80 < lVar10) {
          lVar11 = lVar10;
        }
        uVar3 = (uint8_t)lVar11;
      }
    }
    else {
LAB_00126d3a:
      uVar3 = '\0';
    }
    uVar15 = uVar3;
    if (a != (uint8_t *)0x0) {
      uVar15 = *a;
    }
    if (b != (uint8_t *)0x0) {
      uVar3 = *b;
    }
    bVar24 = SBORROW1(uVar15,uVar3);
    bVar23 = (char)(uVar15 - uVar3) < '\0';
    goto LAB_00126e48;
  case BASE_TYPE_UCHAR:
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) goto LAB_00126f2e;
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      goto LAB_00126a55;
    }
LAB_00126ad1:
    bVar2 = 0;
LAB_00126ad3:
    bVar14 = bVar2;
    if (a != (uint8_t *)0x0) {
      bVar14 = *a;
    }
    if (b != (uint8_t *)0x0) {
      bVar2 = *b;
    }
    bVar23 = bVar14 < bVar2;
    break;
  case BASE_TYPE_SHORT:
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToNumber(const char *, T *) [T = short]";
        goto LAB_00126f43;
      }
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      if ((bVar2 == 0x30) && ((*pbVar8 & 0xdf) == 0x58)) {
        iVar20 = 0x10;
      }
      else {
        iVar20 = 10;
      }
      local_30 = pbVar22;
      lVar10 = strtoll_l((char *)pbVar22,(char **)&local_30,iVar20,ClassicLocale::instance_);
      if (local_30 == pbVar22 || *local_30 != 0) goto LAB_00126e30;
      sVar4 = 0x7fff;
      if (lVar10 < 0x8000) {
        lVar11 = -0x8000;
        if (-0x8000 < lVar10) {
          lVar11 = lVar10;
        }
        sVar4 = (short)lVar11;
      }
    }
    else {
LAB_00126e30:
      sVar4 = 0;
    }
    sVar16 = sVar4;
    if (a != (uint8_t *)0x0) {
      sVar16 = *(short *)a;
    }
    if (b != (uint8_t *)0x0) {
      sVar4 = *(short *)b;
    }
    bVar24 = SBORROW2(sVar16,sVar4);
    bVar23 = (short)(sVar16 - sVar4) < 0;
    goto LAB_00126e48;
  case BASE_TYPE_USHORT:
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]";
        goto LAB_00126f43;
      }
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      if ((bVar2 == 0x30) && ((*pbVar8 & 0xdf) == 0x58)) {
        iVar20 = 0x10;
      }
      else {
        iVar20 = 10;
      }
      local_30 = pbVar22;
      uVar12 = strtoll_l((char *)pbVar22,(char **)&local_30,iVar20,ClassicLocale::instance_);
      if (local_30 == pbVar22 || *local_30 != 0) goto LAB_00126e9f;
      uVar13 = 0xffff;
      if (uVar12 < 0xffff) {
        uVar13 = uVar12;
      }
      uVar5 = (ushort)uVar13;
    }
    else {
LAB_00126e9f:
      uVar5 = 0;
    }
    uVar17 = uVar5;
    if (a != (uint8_t *)0x0) {
      uVar17 = *(ushort *)a;
    }
    if (b != (uint8_t *)0x0) {
      uVar5 = *(ushort *)b;
    }
    bVar23 = uVar17 < uVar5;
    break;
  case BASE_TYPE_INT:
    iVar20 = 0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToNumber(const char *, T *) [T = int]";
        goto LAB_00126f43;
      }
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      if ((bVar2 == 0x30) && ((*pbVar8 & 0xdf) == 0x58)) {
        iVar19 = 0x10;
      }
      else {
        iVar19 = 10;
      }
      local_30 = pbVar22;
      lVar10 = strtoll_l((char *)pbVar22,(char **)&local_30,iVar19,ClassicLocale::instance_);
      if (((local_30 != pbVar22 && *local_30 == 0) && (iVar20 = 0x7fffffff, lVar10 < 0x80000000)) &&
         (iVar20 = -0x80000000, -0x80000000 < lVar10)) {
        iVar20 = (int)lVar10;
      }
    }
    iVar19 = iVar20;
    if (a != (uint8_t *)0x0) {
      iVar19 = *(int *)a;
    }
    if (b != (uint8_t *)0x0) {
      iVar20 = *(int *)b;
    }
    bVar24 = SBORROW4(iVar19,iVar20);
    bVar23 = iVar19 - iVar20 < 0;
    goto LAB_00126e48;
  case BASE_TYPE_UINT:
    uVar12 = 0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      pbVar8 = pbVar22;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned int]";
        goto LAB_00126f43;
      }
      do {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        if (bVar2 == 0) break;
      } while (9 < (int)(char)bVar2 - 0x30U);
      if ((bVar2 == 0x30) && ((*pbVar8 & 0xdf) == 0x58)) {
        iVar20 = 0x10;
      }
      else {
        iVar20 = 10;
      }
      local_30 = pbVar22;
      uVar13 = strtoll_l((char *)pbVar22,(char **)&local_30,iVar20,ClassicLocale::instance_);
      if ((local_30 != pbVar22 && *local_30 == 0) && (uVar12 = 0xffffffff, uVar13 < 0xffffffff)) {
        uVar12 = uVar13;
      }
    }
    uVar21 = (uint)uVar12;
    uVar6 = uVar21;
    if (a != (uint8_t *)0x0) {
      uVar6 = *(uint *)a;
    }
    if (b != (uint8_t *)0x0) {
      uVar21 = *(uint *)b;
    }
    bVar23 = uVar6 < uVar21;
    break;
  case BASE_TYPE_LONG:
    local_30 = (byte *)0x0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      StringToIntegerImpl<long>((long *)&local_30,(key->value).constant._M_dataplus._M_p,0,true);
    }
    if (a == (uint8_t *)0x0) {
      a = (uint8_t *)&local_30;
    }
    ppbVar7 = &local_30;
    if (b != (uint8_t *)0x0) {
      ppbVar7 = (byte **)b;
    }
    bVar24 = SBORROW8((long)*(byte **)a,(long)*ppbVar7);
    bVar23 = (long)*(byte **)a - (long)*ppbVar7 < 0;
LAB_00126e48:
    bVar23 = bVar24 != bVar23;
    break;
  case BASE_TYPE_ULONG:
    local_30 = (byte *)0x0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pcVar18 = (key->value).constant._M_dataplus._M_p;
      bVar23 = StringToIntegerImpl<unsigned_long>((unsigned_long *)&local_30,pcVar18,0,true);
      if ((bVar23) && (local_30 != (byte *)0x0)) {
        pcVar9 = pcVar18 + -1;
        do {
          pcVar1 = pcVar9 + 1;
          pcVar9 = pcVar9 + 1;
          if (*pcVar1 == '\0') break;
        } while (9 < (int)*pcVar1 - 0x30U);
        if (pcVar9[-(ulong)(pcVar18 < pcVar9)] == '-') {
          local_30 = (byte *)0xffffffffffffffff;
        }
      }
    }
    if (a == (uint8_t *)0x0) {
      a = (uint8_t *)&local_30;
    }
    ppbVar7 = &local_30;
    if (b != (uint8_t *)0x0) {
      ppbVar7 = (byte **)b;
    }
    bVar23 = *(byte **)a < *ppbVar7;
    break;
  case BASE_TYPE_FLOAT:
    fVar27 = 0.0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]";
LAB_00126f98:
        __assert_fail("str && val",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x138,pcVar18);
      }
      local_30 = pbVar22;
      fVar25 = strtof_l((char *)pbVar22,(char **)&local_30,ClassicLocale::instance_);
      fVar27 = 0.0;
      if (((local_30 != pbVar22) && (*local_30 == 0)) && (fVar27 = fVar25, NAN(fVar25))) {
        fVar27 = NAN;
      }
    }
    fVar25 = fVar27;
    if (a != (uint8_t *)0x0) {
      fVar25 = *(float *)a;
    }
    if (b != (uint8_t *)0x0) {
      fVar27 = *(float *)b;
    }
    bVar23 = fVar27 == fVar25;
    bVar24 = fVar27 < fVar25;
    goto LAB_0012689e;
  case BASE_TYPE_DOUBLE:
    dVar28 = 0.0;
    if (a == (uint8_t *)0x0 || b == (uint8_t *)0x0) {
      pbVar22 = (byte *)(key->value).constant._M_dataplus._M_p;
      if (pbVar22 == (byte *)0x0) {
        pcVar18 = "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]";
        goto LAB_00126f98;
      }
      local_30 = pbVar22;
      dVar26 = strtod_l((char *)pbVar22,(char **)&local_30,ClassicLocale::instance_);
      dVar28 = 0.0;
      if (((local_30 != pbVar22) && (*local_30 == 0)) && (dVar28 = dVar26, NAN(dVar26))) {
        dVar28 = NAN;
      }
    }
    dVar26 = dVar28;
    if (a != (uint8_t *)0x0) {
      dVar26 = *(double *)a;
    }
    if (b != (uint8_t *)0x0) {
      dVar28 = *(double *)b;
    }
    bVar23 = dVar28 == dVar26;
    bVar24 = dVar28 < dVar26;
LAB_0012689e:
    bVar23 = !bVar24 && !bVar23;
    break;
  default:
    __assert_fail("false && \"scalar type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0xda,
                  "bool flatbuffers::(anonymous namespace)::CompareSerializedScalars(const uint8_t *, const uint8_t *, const FieldDef &)"
                 );
  }
  return bVar23;
}

Assistant:

static bool CompareSerializedScalars(const uint8_t *a, const uint8_t *b,
                                     const FieldDef &key) {
  switch (key.value.type.base_type) {
#define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...)                       \
  case BASE_TYPE_##ENUM: {                                              \
    CTYPE def = static_cast<CTYPE>(0);                                  \
    if (!a || !b) { StringToNumber(key.value.constant.c_str(), &def); } \
    const auto av = a ? ReadScalar<CTYPE>(a) : def;                     \
    const auto bv = b ? ReadScalar<CTYPE>(b) : def;                     \
    return av < bv;                                                     \
  }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
#undef FLATBUFFERS_TD
    default: {
      FLATBUFFERS_ASSERT(false && "scalar type expected");
      return false;
    }
  }
}